

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbinode.cpp
# Opt level: O0

void __thiscall
icu_63::RBBINode::findNodes(RBBINode *this,UVector *dest,NodeType kind,UErrorCode *status)

{
  UBool UVar1;
  UErrorCode *status_local;
  NodeType kind_local;
  UVector *dest_local;
  RBBINode *this_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    if (this->fType == kind) {
      UVector::addElement(dest,this,status);
    }
    if (this->fLeftChild != (RBBINode *)0x0) {
      findNodes(this->fLeftChild,dest,kind,status);
    }
    if (this->fRightChild != (RBBINode *)0x0) {
      findNodes(this->fRightChild,dest,kind,status);
    }
  }
  return;
}

Assistant:

void   RBBINode::findNodes(UVector *dest, RBBINode::NodeType kind, UErrorCode &status) {
    /* test for buffer overflows */
    if (U_FAILURE(status)) {
        return;
    }
    if (fType == kind) {
        dest->addElement(this, status);
    }
    if (fLeftChild != NULL) {
        fLeftChild->findNodes(dest, kind, status);
    }
    if (fRightChild != NULL) {
        fRightChild->findNodes(dest, kind, status);
    }
}